

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O2

aiMesh * __thiscall Assimp::SkeletonMeshBuilder::CreateMesh(SkeletonMeshBuilder *this)

{
  pointer paVar1;
  pointer paVar2;
  pointer pFVar3;
  aiVector3D *paVar4;
  pointer __src;
  pointer ppaVar5;
  uint uVar6;
  aiMesh *this_00;
  ulong uVar7;
  aiVector3D *paVar8;
  ulong *puVar9;
  aiFace *paVar10;
  uint *puVar11;
  long lVar12;
  aiBone **__dest;
  aiFace *paVar13;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  aiVector3t<float> aVar21;
  aiVector3t<float> local_50;
  aiVector3t<float> local_40;
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  paVar1 = (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar2 = (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar14 = (long)paVar2 - (long)paVar1;
  uVar7 = (long)sVar14 / 0xc;
  uVar6 = (uint)uVar7;
  this_00->mNumVertices = uVar6;
  uVar7 = uVar7 & 0xffffffff;
  uVar16 = uVar7 * 0xc;
  paVar8 = (aiVector3D *)operator_new__(uVar16);
  if (uVar7 != 0) {
    memset(paVar8,0,((uVar16 - 0xc) - (uVar16 - 0xc) % 0xc) + 0xc);
  }
  this_00->mVertices = paVar8;
  if (paVar2 != paVar1) {
    memmove(paVar8,paVar1,sVar14);
  }
  paVar8 = (aiVector3D *)operator_new__(uVar16);
  if (uVar6 != 0) {
    memset(paVar8,0,((uVar16 - 0xc) - (uVar16 - 0xc) % 0xc) + 0xc);
  }
  this_00->mNormals = paVar8;
  uVar7 = ((long)(this->mFaces).
                 super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mFaces).
                super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  this_00->mNumFaces = (uint)uVar7;
  uVar16 = uVar7 & 0xffffffff;
  puVar9 = (ulong *)operator_new__(uVar16 * 0x10 + 8);
  *puVar9 = uVar16;
  paVar10 = (aiFace *)(puVar9 + 1);
  if (uVar16 != 0) {
    paVar13 = paVar10;
    do {
      paVar13->mNumIndices = 0;
      paVar13->mIndices = (uint *)0x0;
      paVar13 = paVar13 + 1;
    } while (paVar13 != paVar10 + uVar16);
  }
  this_00->mFaces = paVar10;
  lVar15 = 0;
  for (uVar16 = 0; uVar16 < (uVar7 & 0xffffffff); uVar16 = uVar16 + 1) {
    pFVar3 = (this->mFaces).
             super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar10 = this_00->mFaces;
    paVar10[uVar16].mNumIndices = 3;
    puVar11 = (uint *)operator_new__(0xc);
    paVar10[uVar16].mIndices = puVar11;
    *puVar11 = pFVar3[uVar16].mIndices[0];
    paVar10[uVar16].mIndices[1] = pFVar3[uVar16].mIndices[1];
    uVar6 = pFVar3[uVar16].mIndices[2];
    paVar10[uVar16].mIndices[2] = uVar6;
    paVar1 = (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_40 = operator-(paVar1 + uVar6,paVar1 + pFVar3[uVar16].mIndices[0]);
    paVar1 = (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_50 = operator-(paVar1 + pFVar3[uVar16].mIndices[1],paVar1 + pFVar3[uVar16].mIndices[0]);
    aVar21 = operator^(&local_40,&local_50);
    fVar18 = aVar21.z;
    fVar19 = SQRT(fVar18 * fVar18 + aVar21.x * aVar21.x + aVar21.y * aVar21.y);
    uVar20 = 0x3f800000;
    if (1e-05 <= fVar19) {
      uVar20 = aVar21._0_8_;
    }
    fVar17 = 0.0;
    if (1e-05 <= fVar19) {
      fVar17 = fVar18;
    }
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      paVar4 = this_00->mNormals;
      uVar6 = *(uint *)((long)pFVar3->mIndices + lVar12 * 4 + lVar15);
      paVar8 = paVar4 + uVar6;
      paVar8->x = (float)(int)uVar20;
      paVar8->y = (float)(int)((ulong)uVar20 >> 0x20);
      paVar4[uVar6].z = fVar17;
    }
    uVar7 = (ulong)this_00->mNumFaces;
    lVar15 = lVar15 + 0xc;
  }
  __src = (this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  ppaVar5 = (this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = (long)ppaVar5 - (long)__src;
  this_00->mNumBones = (uint)(uVar7 >> 3);
  __dest = (aiBone **)operator_new__(uVar7 & 0x7fffffff8);
  this_00->mBones = __dest;
  sVar14 = (long)ppaVar5 - (long)__src;
  if (sVar14 != 0) {
    memmove(__dest,__src,sVar14);
  }
  this_00->mMaterialIndex = 0;
  return this_00;
}

Assistant:

aiMesh* SkeletonMeshBuilder::CreateMesh()
{
    aiMesh* mesh = new aiMesh();

    // add points
    mesh->mNumVertices = static_cast<unsigned int>(mVertices.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy( mVertices.begin(), mVertices.end(), mesh->mVertices);

    mesh->mNormals = new aiVector3D[mesh->mNumVertices];

    // add faces
    mesh->mNumFaces = static_cast<unsigned int>(mFaces.size());
    mesh->mFaces = new aiFace[mesh->mNumFaces];
    for( unsigned int a = 0; a < mesh->mNumFaces; a++)
    {
        const Face& inface = mFaces[a];
        aiFace& outface = mesh->mFaces[a];
        outface.mNumIndices = 3;
        outface.mIndices = new unsigned int[3];
        outface.mIndices[0] = inface.mIndices[0];
        outface.mIndices[1] = inface.mIndices[1];
        outface.mIndices[2] = inface.mIndices[2];

        // Compute per-face normals ... we don't want the bones to be smoothed ... they're built to visualize
        // the skeleton, so it's good if there's a visual difference to the rest of the geometry
        aiVector3D nor = ((mVertices[inface.mIndices[2]] - mVertices[inface.mIndices[0]]) ^
            (mVertices[inface.mIndices[1]] - mVertices[inface.mIndices[0]]));

        if (nor.Length() < 1e-5) /* ensure that FindInvalidData won't remove us ...*/
            nor = aiVector3D(1.0,0.0,0.0);

        for (unsigned int n = 0; n < 3; ++n)
            mesh->mNormals[inface.mIndices[n]] = nor;
    }

    // add the bones
    mesh->mNumBones = static_cast<unsigned int>(mBones.size());
    mesh->mBones = new aiBone*[mesh->mNumBones];
    std::copy( mBones.begin(), mBones.end(), mesh->mBones);

    // default
    mesh->mMaterialIndex = 0;

    return mesh;
}